

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::init
          (DefaultFBOMultisampleCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  TestLog *pTVar2;
  RenderContext *renderCtx;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int extraout_EAX;
  mapped_type *pmVar7;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  MessageBuilder *this_01;
  ShaderProgram *pSVar10;
  ProgramSources *pPVar11;
  NotSupportedError *this_02;
  TestError *this_03;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  undefined1 local_2f0 [40];
  string local_2c8;
  StringTemplate local_2a8;
  string local_288;
  string local_268;
  StringTemplate local_248;
  string local_228;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [176];
  pointer local_100;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  long lVar8;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GLSL_VERSION_DECL",(allocator<char> *)local_2f0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)local_1b0);
  std::__cxx11::string::assign((char *)pmVar7);
  std::__cxx11::string::~string((string *)local_1b0);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar9->m_numSamples < 2) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"No multisample buffers",(allocator<char> *)local_2f0);
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this->m_initCalled = true;
  (**(code **)(lVar8 + 0x868))(0x80a9,&this->m_numSamples);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"getIntegerv(GL_SAMPLES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x108);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"GL_SAMPLES = ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_numSamples);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  pSVar10 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100 = (pointer)0x0;
  uStack_f8 = 0;
  uStack_f7 = 0;
  uStack_f0 = 0;
  uStack_ef = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin mediump vec4 a_color;\nout mediump vec4 v_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_2f1);
  tcu::StringTemplate::StringTemplate(&local_248,&local_268);
  tcu::StringTemplate::specialize(&local_228,&local_248,&args);
  glu::VertexSource::VertexSource((VertexSource *)local_2f0,&local_228);
  pPVar11 = glu::ProgramSources::operator<<((ProgramSources *)local_1b0,(ShaderSource *)local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,&local_2f2);
  tcu::StringTemplate::StringTemplate(&local_2a8,&local_2c8);
  tcu::StringTemplate::specialize(&local_288,&local_2a8,&args);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1d8,&local_288);
  pPVar11 = glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)local_1d8);
  glu::ShaderProgram::ShaderProgram(pSVar10,renderCtx,pPVar11);
  this->m_program = pSVar10;
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_288);
  tcu::StringTemplate::~StringTemplate(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)(local_2f0 + 8));
  std::__cxx11::string::~string((string *)&local_228);
  tcu::StringTemplate::~StringTemplate(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Failed to compile program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
               ,0x113);
  }
  else {
    iVar4 = (**(code **)(lVar8 + 0x780))((this->m_program->m_program).m_program,"a_position");
    this->m_attrPositionLoc = iVar4;
    iVar4 = (**(code **)(lVar8 + 0x780))((this->m_program->m_program).m_program,"a_color");
    this->m_attrColorLoc = iVar4;
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"getAttribLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x117);
    if ((-1 < this->m_attrPositionLoc) && (-1 < this->m_attrColorLoc)) {
      iVar4 = this->m_desiredViewportSize;
      pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar1 = pRVar9->m_width;
      pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar6 = pRVar9->m_height;
      if (iVar1 < pRVar9->m_height) {
        iVar6 = iVar1;
      }
      if (iVar4 < iVar6) {
        iVar6 = iVar4;
      }
      this->m_viewportSize = iVar6;
      randomizeViewport(this);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&args._M_t);
      return extraout_EAX;
    }
    pSVar10 = this->m_program;
    if (pSVar10 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar10);
    }
    operator_delete(pSVar10,0xd0);
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Invalid attribute locations",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
               ,0x11c);
  }
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DefaultFBOMultisampleCase::init (void)
{
	const bool					supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_DECL"] = supportsES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	static const char* vertShaderSource =
		"${GLSL_VERSION_DECL}\n"
		"in highp vec4 a_position;\n"
		"in mediump vec4 a_color;\n"
		"out mediump vec4 v_color;\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = a_color;\n"
		"}\n";

	static const char* fragShaderSource =
		"${GLSL_VERSION_DECL}\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main()\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	TestLog&				log	= m_testCtx.getLog();
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	if (m_context.getRenderTarget().getNumSamples() <= 1)
		throw tcu::NotSupportedError("No multisample buffers");

	m_initCalled = true;

	// Query and log number of samples per pixel.

	gl.getIntegerv(GL_SAMPLES, &m_numSamples);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_SAMPLES)");
	log << TestLog::Message << "GL_SAMPLES = " << m_numSamples << TestLog::EndMessage;

	// Prepare program.

	DE_ASSERT(!m_program);

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource(tcu::StringTemplate(vertShaderSource).specialize(args))
		<< glu::FragmentSource(tcu::StringTemplate(fragShaderSource).specialize(args)));
	if (!m_program->isOk())
		throw tcu::TestError("Failed to compile program", DE_NULL, __FILE__, __LINE__);

	m_attrPositionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_attrColorLoc		= gl.getAttribLocation(m_program->getProgram(), "a_color");
	GLU_EXPECT_NO_ERROR(gl.getError(), "getAttribLocation");

	if (m_attrPositionLoc < 0 || m_attrColorLoc < 0)
	{
		delete m_program;
		throw tcu::TestError("Invalid attribute locations", DE_NULL, __FILE__, __LINE__);
	}

	// Get suitable viewport size.

	m_viewportSize = de::min<int>(m_desiredViewportSize, de::min(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight()));
	randomizeViewport();
}